

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_dynamic_histogram<double,_(unsigned_char)'\x02'>::observe
          (basic_dynamic_histogram<double,_(unsigned_char)__x02_> *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_value,double value)

{
  pointer pdVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  double local_30;
  
  pdVar1 = (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30 = value;
  _Var2 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,__gnu_cxx::__ops::_Iter_less_val>
                    (pdVar1,(this->bucket_boundaries_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_30);
  basic_dynamic_counter<double,_(unsigned_char)'\x02'>::inc
            (&((this->sum_).
               super___shared_ptr<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>,labels_value,
             local_30);
  basic_dynamic_counter<double,_(unsigned_char)'\x02'>::inc
            (*(basic_dynamic_counter<double,_(unsigned_char)__x02_> **)
              ((long)(this->bucket_counts_).
                     super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
              ((long)_Var2._M_current - (long)pdVar1) * 2),labels_value,1.0);
  return;
}

Assistant:

void observe(const std::array<std::string, N> &labels_value,
               value_type value) {
    const auto bucket_index = static_cast<std::size_t>(
        std::distance(bucket_boundaries_.begin(),
                      std::lower_bound(bucket_boundaries_.begin(),
                                       bucket_boundaries_.end(), value)));
    sum_->inc(labels_value, value);
    bucket_counts_[bucket_index]->inc(labels_value);
  }